

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

void __thiscall CaDiCaL::Solver::message(Solver *this)

{
  long lVar1;
  long lVar2;
  State *pSVar3;
  Internal *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  pSVar3 = state((Solver *)in_RDI);
  if (*pSVar3 != DELETING) {
    require_solver_pointer_to_be_non_zero(in_RDI,in_stack_ffffffffffffffe8,(char *)0xe2d871);
    lVar1._0_1_ = in_RDI->external_prop_is_lazy;
    lVar1._1_1_ = in_RDI->forced_backt_allowed;
    lVar1._2_1_ = in_RDI->private_steps;
    lVar1._3_1_ = in_RDI->rephased;
    lVar1._4_4_ = *(undefined4 *)&in_RDI->field_0x14;
    if (lVar1 == 0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","void CaDiCaL::Solver::message()",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      fprintf(_stderr,"external solver not initialized");
      fputc(10,_stderr);
      fflush(_stderr);
      abort();
    }
    lVar2._0_1_ = in_RDI->preprocessing;
    lVar2._1_1_ = in_RDI->protected_reasons;
    lVar2._2_1_ = in_RDI->force_saved_phase;
    lVar2._3_1_ = in_RDI->searching_lucky_phases;
    lVar2._4_1_ = in_RDI->stable;
    lVar2._5_1_ = in_RDI->reported;
    lVar2._6_1_ = in_RDI->external_prop;
    lVar2._7_1_ = in_RDI->did_external_prop;
    if (lVar2 == 0) {
      fatal_message_start();
      fprintf(_stderr,"invalid API usage of \'%s\' in \'%s\': ","void CaDiCaL::Solver::message()",
              "/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/cadical/src/solver.cpp"
             );
      fprintf(_stderr,"internal solver not initialized");
      fputc(10,_stderr);
      fflush(_stderr);
      abort();
    }
    Internal::message(in_RDI);
  }
  return;
}

Assistant:

void Solver::message () {
  if (state () == DELETING)
    return;
  REQUIRE_INITIALIZED ();
#ifndef QUIET
  internal->message ();
#endif
}